

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<wasm::PickLoadSigns,_wasm::Visitor<wasm::PickLoadSigns,_void>_>::walkFunctionInModule
          (Walker<wasm::PickLoadSigns,_wasm::Visitor<wasm::PickLoadSigns,_void>_> *this,
          Function *func,Module *module)

{
  this->currModule = module;
  this->currFunction = func;
  PickLoadSigns::doWalkFunction((PickLoadSigns *)&this[-1].stack.fixed._M_elems[9].currp,func);
  this->currFunction = (Function *)0x0;
  this->currModule = (Module *)0x0;
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }